

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int dup_identities_check(char *id,lys_module *module)

{
  int iVar1;
  lys_module *plVar2;
  bool bVar3;
  int local_2c;
  int i;
  lys_module *mainmod;
  lys_module *module_local;
  char *id_local;
  
  iVar1 = dup_identity_check(id,module->ident,(uint)module->ident_size);
  if (iVar1 == 0) {
    plVar2 = lys_main_module(module);
    local_2c = 0;
    while( true ) {
      bVar3 = false;
      if (local_2c < (int)(uint)plVar2->inc_size) {
        bVar3 = plVar2->inc[local_2c].submodule != (lys_submodule *)0x0;
      }
      if (!bVar3) {
        return 0;
      }
      iVar1 = dup_identity_check(id,(plVar2->inc[local_2c].submodule)->ident,
                                 (uint)(plVar2->inc[local_2c].submodule)->ident_size);
      if (iVar1 != 0) break;
      local_2c = local_2c + 1;
    }
    ly_vlog(LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"identity",id);
  }
  else {
    ly_vlog(LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"identity",id);
  }
  return 1;
}

Assistant:

int
dup_identities_check(const char *id, struct lys_module *module)
{
    struct lys_module *mainmod;
    int i;

    if (dup_identity_check(id, module->ident, module->ident_size)) {
        LOGVAL(LYE_DUPID, LY_VLOG_NONE, NULL, "identity", id);
        return EXIT_FAILURE;
    }

    /* check identity in submodules */
    mainmod = lys_main_module(module);
    for (i = 0; i < mainmod->inc_size && mainmod->inc[i].submodule; ++i) {
        if (dup_identity_check(id, mainmod->inc[i].submodule->ident, mainmod->inc[i].submodule->ident_size)) {
            LOGVAL(LYE_DUPID, LY_VLOG_NONE, NULL, "identity", id);
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}